

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O0

bool SpeedHashChunk(EVP_MD *md,string *name,size_t chunk_len)

{
  bool bVar1;
  anon_class_24_3_1999c073 local_40a0;
  function<bool_()> local_4088;
  undefined1 local_4068 [8];
  TimeResults results;
  string local_4048;
  uint8_t local_4028 [8];
  uint8_t input [16384];
  size_t chunk_len_local;
  string *name_local;
  EVP_MD *md_local;
  
  input._16376_8_ = chunk_len;
  memset(local_4028,0,0x4000);
  if ((ulong)input._16376_8_ < 0x4001) {
    ChunkLenSuffix_abi_cxx11_(&local_4048,input._16376_8_);
    std::__cxx11::string::operator+=((string *)name,(string *)&local_4048);
    std::__cxx11::string::~string((string *)&local_4048);
    local_40a0.chunk_len._0_1_ = input[0x3ff8];
    local_40a0.chunk_len._1_1_ = input[0x3ff9];
    local_40a0.chunk_len._2_1_ = input[0x3ffa];
    local_40a0.chunk_len._3_1_ = input[0x3ffb];
    local_40a0.chunk_len._4_1_ = input[0x3ffc];
    local_40a0.chunk_len._5_1_ = input[0x3ffd];
    local_40a0.chunk_len._6_1_ = input[0x3ffe];
    local_40a0.chunk_len._7_1_ = input[0x3fff];
    local_40a0.input = (uint8_t (*) [16384])local_4028;
    local_40a0.md = md;
    std::function<bool()>::
    function<SpeedHashChunk(env_md_st_const*,std::__cxx11::string,unsigned_long)::__0,void>
              ((function<bool()> *)&local_4088,&local_40a0);
    bVar1 = TimeFunctionParallel((TimeResults *)local_4068,&local_4088);
    std::function<bool_()>::~function(&local_4088);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      TimeResults::PrintWithBytes((TimeResults *)local_4068,name,input._16376_8_);
      md_local._7_1_ = true;
    }
    else {
      fprintf(_stderr,"EVP_DigestInit_ex failed.\n");
      ERR_print_errors_fp(_stderr);
      md_local._7_1_ = false;
    }
  }
  else {
    md_local._7_1_ = false;
  }
  return md_local._7_1_;
}

Assistant:

static bool SpeedHashChunk(const EVP_MD *md, std::string name,
                           size_t chunk_len) {
  uint8_t input[16384] = {0};

  if (chunk_len > sizeof(input)) {
    return false;
  }

  name += ChunkLenSuffix(chunk_len);
  TimeResults results;
  if (!TimeFunctionParallel(&results, [md, chunk_len, &input]() -> bool {
        uint8_t digest[EVP_MAX_MD_SIZE];
        unsigned int md_len;

        bssl::ScopedEVP_MD_CTX ctx;
        return EVP_DigestInit_ex(ctx.get(), md, NULL /* ENGINE */) &&
               EVP_DigestUpdate(ctx.get(), input, chunk_len) &&
               EVP_DigestFinal_ex(ctx.get(), digest, &md_len);
      })) {
    fprintf(stderr, "EVP_DigestInit_ex failed.\n");
    ERR_print_errors_fp(stderr);
    return false;
  }

  results.PrintWithBytes(name, chunk_len);
  return true;
}